

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::
testCreateTransformFeedbacksForInvalidNumberOfObjects(ErrorsTest *this)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  bool bVar2;
  GLuint xfbs;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x408))(0xffffffffffffffff);
  local_1a8.m_value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  bVar2 = local_1a8.m_value != 0x501;
  if (bVar2) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "glCreateTransformFeedbacks called with negative number of objects had been expected to generate GL_INVALID_VALUE. However, "
                   );
    local_1a8.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," was captured.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 8));
  }
  return !bVar2;
}

Assistant:

bool ErrorsTest::testCreateTransformFeedbacksForInvalidNumberOfObjects()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint xfbs = 314159;

	gl.createTransformFeedbacks(-1 /* invalid count */, &xfbs);

	glw::GLenum error = gl.getError();

	if (GL_INVALID_VALUE != error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glCreateTransformFeedbacks called with negative number of objects had "
											   "been expected to generate GL_INVALID_VALUE. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != xfbs)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glCreateTransformFeedbacks called with negative number of objects had "
											   "been expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}